

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

ON_SubDVertexEdgeProperties * __thiscall
ON_SubDVertex::EdgeProperties
          (ON_SubDVertexEdgeProperties *__return_storage_ptr__,ON_SubDVertex *this)

{
  ushort uVar1;
  bool bVar2;
  bool bVar3;
  ON_SubDEdge *this_00;
  ON_SubDVertexEdgeProperties *ep;
  unsigned_short edge_face_count;
  ON_SubDEdge *e;
  unsigned_short vei;
  bool bFirstEdge;
  ON_SubDVertex *this_local;
  
  ON_SubDVertexEdgeProperties::ON_SubDVertexEdgeProperties(__return_storage_ptr__);
  __return_storage_ptr__->m_edge_count = this->m_edge_count;
  __return_storage_ptr__->m_face_count = this->m_face_count;
  bVar2 = true;
  for (e._4_2_ = 0; e._4_2_ < __return_storage_ptr__->m_edge_count; e._4_2_ = e._4_2_ + 1) {
    this_00 = (ON_SubDEdge *)(this->m_edges[e._4_2_].m_ptr & 0xfffffffffffffff8);
    if (this_00 == (ON_SubDEdge *)0x0) {
      __return_storage_ptr__->m_null_edge_count = __return_storage_ptr__->m_null_edge_count + 1;
    }
    else {
      bVar3 = ON_SubDEdge::IsCrease(this_00);
      if (bVar3) {
        __return_storage_ptr__->m_crease_edge_count =
             __return_storage_ptr__->m_crease_edge_count + 1;
      }
      else {
        bVar3 = ON_SubDEdge::IsSmooth(this_00);
        if (bVar3) {
          __return_storage_ptr__->m_smooth_edge_count =
               __return_storage_ptr__->m_smooth_edge_count + 1;
        }
        else {
          __return_storage_ptr__->m_unset_edge_count =
               __return_storage_ptr__->m_unset_edge_count + 1;
        }
      }
      uVar1 = this_00->m_face_count;
      if (bVar2) {
        bVar2 = false;
        __return_storage_ptr__->m_min_edge_face_count = uVar1;
        __return_storage_ptr__->m_max_edge_face_count = uVar1;
      }
      else if (uVar1 < __return_storage_ptr__->m_min_edge_face_count) {
        __return_storage_ptr__->m_min_edge_face_count = uVar1;
      }
      else if (__return_storage_ptr__->m_max_edge_face_count < uVar1) {
        __return_storage_ptr__->m_max_edge_face_count = uVar1;
      }
      if (uVar1 == 0) {
        __return_storage_ptr__->m_wire_edge_count = __return_storage_ptr__->m_wire_edge_count + 1;
      }
      else if (uVar1 == 1) {
        __return_storage_ptr__->m_boundary_edge_count =
             __return_storage_ptr__->m_boundary_edge_count + 1;
      }
      else if (uVar1 == 2) {
        __return_storage_ptr__->m_interior_edge_count =
             __return_storage_ptr__->m_interior_edge_count + 1;
      }
      else {
        __return_storage_ptr__->m_nonmanifold_edge_count =
             __return_storage_ptr__->m_nonmanifold_edge_count + 1;
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

const ON_SubDVertexEdgeProperties ON_SubDVertex::EdgeProperties() const
{
  ON_SubDVertexEdgeProperties ep;

  ep.m_edge_count = m_edge_count;
  ep.m_face_count = m_face_count;

  bool bFirstEdge = true;
  for (unsigned short vei = 0; vei < ep.m_edge_count; vei++)
  {
    const ON_SubDEdge* e = ON_SUBD_EDGE_POINTER(m_edges[vei].m_ptr);
    if (nullptr == e)
    {
      ep.m_null_edge_count++;
      continue;
    }

    if (e->IsCrease())
      ep.m_crease_edge_count++;
    else if (e->IsSmooth())
      ep.m_smooth_edge_count++;
    else
      ep.m_unset_edge_count++;

    const unsigned short edge_face_count = e->m_face_count;
    if (bFirstEdge)
    {
      bFirstEdge = false;
      ep.m_min_edge_face_count = edge_face_count;
      ep.m_max_edge_face_count = edge_face_count;
    }
    else if (edge_face_count < ep.m_min_edge_face_count)
      ep.m_min_edge_face_count = edge_face_count;
    else if (edge_face_count > ep.m_max_edge_face_count)
      ep.m_max_edge_face_count = edge_face_count;

    if (0 == edge_face_count)
      ep.m_wire_edge_count++;
    else if (1 == edge_face_count)
      ep.m_boundary_edge_count++;
    else if (2 == edge_face_count)
      ep.m_interior_edge_count++;
    else
      ep.m_nonmanifold_edge_count++;

  }
  return ep;
}